

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O2

void __thiscall
asmjit::RAAssignment::swap
          (RAAssignment *this,uint32_t group,uint32_t aWorkId,uint32_t aPhysId,uint32_t bWorkId,
          uint32_t bPhysId)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  size_t siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uint32_t uVar6;
  undefined4 in_register_00000084;
  uint32_t uVar7;
  undefined4 in_register_0000008c;
  
  if (aPhysId == bPhysId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0x101,"aPhysId != bPhysId");
  }
  ctx = (EVP_PKEY_CTX *)(ulong)group;
  uVar6 = bWorkId;
  uVar7 = bPhysId;
  uVar4 = workToPhysId(this,group,aWorkId);
  if (uVar4 != aPhysId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0x102,"workToPhysId(group, aWorkId) == aPhysId");
  }
  uVar4 = workToPhysId(this,group,bWorkId);
  if (uVar4 != bPhysId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0x103,"workToPhysId(group, bWorkId) == bPhysId");
  }
  uVar4 = physToWorkId(this,group,aPhysId);
  if (uVar4 == aWorkId) {
    uVar4 = physToWorkId(this,group,bPhysId);
    if (uVar4 != bWorkId) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                 ,0x105,"physToWorkId(group, bPhysId) == bWorkId");
    }
    bVar3 = isPhysAssigned(this,group,aPhysId);
    if (bVar3) {
      bVar3 = isPhysAssigned(this,group,bPhysId);
      if (bVar3) {
        this->_workToPhysMap[aWorkId].physIds[0] = (byte)bPhysId;
        this->_workToPhysMap[bWorkId].physIds[0] = (uint8_t)aPhysId;
        puVar5 = this->_physToWorkIds[(long)ctx];
        puVar5[aPhysId] = bWorkId;
        siglen = (size_t)bPhysId;
        puVar5[siglen] = aWorkId;
        puVar5 = RARegMask::operator[](&this->_physToWorkMap->dirty,group);
        uVar1 = *puVar5;
        puVar5 = RARegMask::operator[](&this->_physToWorkMap->dirty,group);
        uVar2 = 0;
        if (((*puVar5 >> (bPhysId & 0x1f) & 1) != 0) != ((uVar1 >> (aPhysId & 0x1f) & 1) != 0)) {
          uVar2 = 1 << ((byte)bPhysId & 0x1f) | 1 << (aPhysId & 0x1f);
        }
        puVar5 = RARegMask::operator[](&this->_physToWorkMap->dirty,group);
        *puVar5 = *puVar5 ^ uVar2;
        verify(this,ctx,sig,siglen,(uchar *)CONCAT44(in_register_00000084,uVar6),
               CONCAT44(in_register_0000008c,uVar7));
        return;
      }
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
                 ,0x107,"isPhysAssigned(group, bPhysId)");
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0x106,"isPhysAssigned(group, aPhysId)");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/../core/raassignment_p.h"
             ,0x104,"physToWorkId(group, aPhysId) == aWorkId");
}

Assistant:

ASMJIT_INLINE void swap(uint32_t group, uint32_t aWorkId, uint32_t aPhysId, uint32_t bWorkId, uint32_t bPhysId) noexcept {
    ASMJIT_ASSERT(aPhysId != bPhysId);
    ASMJIT_ASSERT(workToPhysId(group, aWorkId) == aPhysId);
    ASMJIT_ASSERT(workToPhysId(group, bWorkId) == bPhysId);
    ASMJIT_ASSERT(physToWorkId(group, aPhysId) == aWorkId);
    ASMJIT_ASSERT(physToWorkId(group, bPhysId) == bWorkId);
    ASMJIT_ASSERT(isPhysAssigned(group, aPhysId));
    ASMJIT_ASSERT(isPhysAssigned(group, bPhysId));

    _workToPhysMap->physIds[aWorkId] = uint8_t(bPhysId);
    _workToPhysMap->physIds[bWorkId] = uint8_t(aPhysId);
    _physToWorkIds[group][aPhysId] = bWorkId;
    _physToWorkIds[group][bPhysId] = aWorkId;

    uint32_t aMask = Support::bitMask(aPhysId);
    uint32_t bMask = Support::bitMask(bPhysId);

    uint32_t flipMask = Support::bitMaskFromBool<uint32_t>(
      ((_physToWorkMap->dirty[group] & aMask) != 0) ^
      ((_physToWorkMap->dirty[group] & bMask) != 0));

    uint32_t regMask = aMask | bMask;
    _physToWorkMap->dirty[group] ^= regMask & flipMask;

    verify();
  }